

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.hpp
# Opt level: O0

void __thiscall jsoncons::binary_stream_sink::push_back(binary_stream_sink *this,uint8_t ch)

{
  uint8_t *puVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  uint8_t in_SIL;
  binary_stream_sink *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  if (in_RDI->p_ < in_RDI->end_buffer_) {
    puVar1 = in_RDI->p_;
    in_RDI->p_ = puVar1 + 1;
    *puVar1 = in_SIL;
  }
  else {
    pbVar2 = in_RDI->stream_ptr_;
    puVar1 = in_RDI->begin_buffer_;
    buffer_length(in_RDI);
    std::ostream::write((char *)pbVar2,(long)puVar1);
    in_RDI->p_ = in_RDI->begin_buffer_;
    push_back((binary_stream_sink *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
              (uint8_t)((ulong)in_RDI >> 0x38));
  }
  return;
}

Assistant:

void push_back(uint8_t ch)
        {
            if (p_ < end_buffer_)
            {
                *p_++ = ch;
            }
            else
            {
                stream_ptr_->write((char*)begin_buffer_, buffer_length());
                p_ = begin_buffer_;
                push_back(ch);
            }
        }